

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O2

size_t Diligent::CalculatePipelineResourceSignatureDescHash(PipelineResourceSignatureDesc *Desc)

{
  PipelineResourceDesc *pPVar1;
  Uint32 i_1;
  long lVar2;
  Uint32 i;
  ulong uVar3;
  uint local_4c;
  size_t Hash;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  Hash = ComputeHash<unsigned_int,unsigned_int,unsigned_char>
                   (&Desc->NumResources,&Desc->NumImmutableSamplers,&Desc->BindingIndex);
  lVar2 = 0xc;
  for (uVar3 = 0; uVar3 < Desc->NumResources; uVar3 = uVar3 + 1) {
    pPVar1 = Desc->Resources;
    local_4c = *(uint *)((long)pPVar1 + lVar2 + -4);
    local_34 = (uint)*(byte *)((long)&pPVar1->Name + lVar2 + 4);
    local_38 = (uint)*(byte *)((long)&pPVar1->Name + lVar2 + 5);
    local_3c = (uint)*(byte *)((long)&pPVar1->Name + lVar2 + 6);
    HashCombine<unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              (&Hash,&local_4c,(uint *)((long)&pPVar1->Name + lVar2),&local_34,&local_38,&local_3c);
    lVar2 = lVar2 + 0x18;
  }
  lVar2 = 0x10;
  for (uVar3 = 0; uVar3 < Desc->NumImmutableSamplers; uVar3 = uVar3 + 1) {
    local_4c = *(uint *)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar2 + -0x3c);
    HashCombine<unsigned_int,Diligent::SamplerDesc>
              (&Hash,&local_4c,
               (SamplerDesc *)((long)(Desc->ImmutableSamplers->Desc).BorderColor + lVar2 + -0x2c));
    lVar2 = lVar2 + 0x48;
  }
  return Hash;
}

Assistant:

size_t CalculatePipelineResourceSignatureDescHash(const PipelineResourceSignatureDesc& Desc) noexcept
{
    size_t Hash = ComputeHash(Desc.NumResources, Desc.NumImmutableSamplers, Desc.BindingIndex);

    for (Uint32 i = 0; i < Desc.NumResources; ++i)
    {
        const PipelineResourceDesc& Res = Desc.Resources[i];
        HashCombine(Hash, Uint32{Res.ShaderStages}, Res.ArraySize, Uint32{Res.ResourceType}, Uint32{Res.VarType}, Uint32{Res.Flags});
    }

    for (Uint32 i = 0; i < Desc.NumImmutableSamplers; ++i)
    {
        HashCombine(Hash, Uint32{Desc.ImmutableSamplers[i].ShaderStages}, Desc.ImmutableSamplers[i].Desc);
    }

    return Hash;
}